

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O3

int32_t utrie_unserializeDummy_63
                  (UTrie *trie,void *data,int32_t length,uint32_t initialValue,
                  uint32_t leadUnitValue,UBool make16BitTrie,UErrorCode *pErrorCode)

{
  undefined8 *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  undefined4 *puVar4;
  long lVar5;
  uint uVar6;
  int32_t iVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  
  if (pErrorCode == (UErrorCode *)0x0) {
    return -1;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return -1;
  }
  trie->indexLength = 0x820;
  uVar6 = leadUnitValue != initialValue | 8;
  trie->dataLength = uVar6 * 0x20;
  if (make16BitTrie == '\0') {
    iVar7 = uVar6 * 0x80 + 0x1040;
    if (length < iVar7) goto LAB_001d3e69;
    trie->isLatin1Linear = '\x01';
    trie->initialValue = initialValue;
    trie->index = (uint16_t *)data;
    memset(data,0,0x1040);
    if (leadUnitValue != initialValue) {
      *(undefined8 *)((long)data + 0xd80) = 0x40004000400040;
      *(undefined8 *)((long)data + 0xd88) = 0x40004000400040;
      *(undefined8 *)((long)data + 0xd90) = 0x40004000400040;
      *(undefined8 *)((long)data + 0xd98) = 0x40004000400040;
      *(undefined8 *)((long)data + 0xda0) = 0x40004000400040;
      *(undefined8 *)((long)data + 0xda8) = 0x40004000400040;
      *(undefined8 *)((long)data + 0xdb0) = 0x40004000400040;
      *(undefined8 *)((long)data + 0xdb8) = 0x40004000400040;
    }
    puVar2 = (uint32_t *)((long)data + (long)trie->indexLength * 2);
    trie->data32 = puVar2;
    lVar5 = 0;
    do {
      puVar3 = puVar2 + lVar5;
      *puVar3 = initialValue;
      puVar3[1] = initialValue;
      puVar3[2] = initialValue;
      puVar3[3] = initialValue;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x100);
    if (leadUnitValue != initialValue) {
      lVar5 = 0;
      do {
        puVar3 = puVar2 + lVar5 + 0x100;
        *puVar3 = leadUnitValue;
        puVar3[1] = leadUnitValue;
        puVar3[2] = leadUnitValue;
        puVar3[3] = leadUnitValue;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x20);
    }
  }
  else {
    iVar7 = uVar6 * 0x40 + 0x1040;
    if (length < iVar7) {
LAB_001d3e69:
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      return iVar7;
    }
    trie->isLatin1Linear = '\x01';
    trie->initialValue = initialValue;
    trie->index = (uint16_t *)data;
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)data + lVar5 * 2);
      *puVar1 = 0x208020802080208;
      puVar1[1] = 0x208020802080208;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x820);
    if (leadUnitValue != initialValue) {
      *(undefined8 *)((long)data + 0xd80) = 0x248024802480248;
      *(undefined8 *)((long)data + 0xd88) = 0x248024802480248;
      *(undefined8 *)((long)data + 0xd90) = 0x248024802480248;
      *(undefined8 *)((long)data + 0xd98) = 0x248024802480248;
      *(undefined8 *)((long)data + 0xda0) = 0x248024802480248;
      *(undefined8 *)((long)data + 0xda8) = 0x248024802480248;
      *(undefined8 *)((long)data + 0xdb0) = 0x248024802480248;
      *(undefined8 *)((long)data + 0xdb8) = 0x248024802480248;
    }
    trie->data32 = (uint32_t *)0x0;
    auVar9 = pshuflw(ZEXT416(initialValue),ZEXT416(initialValue),0);
    uVar8 = auVar9._0_4_;
    lVar5 = 0;
    do {
      puVar4 = (undefined4 *)((long)data + lVar5 * 2 + 0x1040);
      *puVar4 = uVar8;
      puVar4[1] = uVar8;
      puVar4[2] = uVar8;
      puVar4[3] = uVar8;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x100);
    if (leadUnitValue != initialValue) {
      auVar9 = pshuflw(ZEXT416(leadUnitValue),ZEXT416(leadUnitValue),0);
      uVar8 = auVar9._0_4_;
      *(undefined4 *)((long)data + 0x1240) = uVar8;
      *(undefined4 *)((long)data + 0x1244) = uVar8;
      *(undefined4 *)((long)data + 0x1248) = uVar8;
      *(undefined4 *)((long)data + 0x124c) = uVar8;
      *(undefined4 *)((long)data + 0x1250) = uVar8;
      *(undefined4 *)((long)data + 0x1254) = uVar8;
      *(undefined4 *)((long)data + 0x1258) = uVar8;
      *(undefined4 *)((long)data + 0x125c) = uVar8;
      *(undefined4 *)((long)data + 0x1260) = uVar8;
      *(undefined4 *)((long)data + 0x1264) = uVar8;
      *(undefined4 *)((long)data + 0x1268) = uVar8;
      *(undefined4 *)((long)data + 0x126c) = uVar8;
      *(undefined4 *)((long)data + 0x1270) = uVar8;
      *(undefined4 *)((long)data + 0x1274) = uVar8;
      *(undefined4 *)((long)data + 0x1278) = uVar8;
      *(undefined4 *)((long)data + 0x127c) = uVar8;
    }
  }
  trie->getFoldingOffset = utrie_defaultGetFoldingOffset_63;
  return iVar7;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_unserializeDummy(UTrie *trie,
                       void *data, int32_t length,
                       uint32_t initialValue, uint32_t leadUnitValue,
                       UBool make16BitTrie,
                       UErrorCode *pErrorCode) {
    uint16_t *p16;
    int32_t actualLength, latin1Length, i, limit;
    uint16_t block;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return -1;
    }

    /* calculate the actual size of the dummy trie data */

    /* max(Latin-1, block 0) */
    latin1Length= 256; /*UTRIE_SHIFT<=8 ? 256 : UTRIE_DATA_BLOCK_LENGTH;*/

    trie->indexLength=UTRIE_BMP_INDEX_LENGTH+UTRIE_SURROGATE_BLOCK_COUNT;
    trie->dataLength=latin1Length;
    if(leadUnitValue!=initialValue) {
        trie->dataLength+=UTRIE_DATA_BLOCK_LENGTH;
    }

    actualLength=trie->indexLength*2;
    if(make16BitTrie) {
        actualLength+=trie->dataLength*2;
    } else {
        actualLength+=trie->dataLength*4;
    }

    /* enough space for the dummy trie? */
    if(length<actualLength) {
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        return actualLength;
    }

    trie->isLatin1Linear=TRUE;
    trie->initialValue=initialValue;

    /* fill the index and data arrays */
    p16=(uint16_t *)data;
    trie->index=p16;

    if(make16BitTrie) {
        /* indexes to block 0 */
        block=(uint16_t)(trie->indexLength>>UTRIE_INDEX_SHIFT);
        limit=trie->indexLength;
        for(i=0; i<limit; ++i) {
            p16[i]=block;
        }

        if(leadUnitValue!=initialValue) {
            /* indexes for lead surrogate code units to the block after Latin-1 */
            block+=(uint16_t)(latin1Length>>UTRIE_INDEX_SHIFT);
            i=0xd800>>UTRIE_SHIFT;
            limit=0xdc00>>UTRIE_SHIFT;
            for(; i<limit; ++i) {
                p16[i]=block;
            }
        }

        trie->data32=NULL;

        /* Latin-1 data */
        p16+=trie->indexLength;
        for(i=0; i<latin1Length; ++i) {
            p16[i]=(uint16_t)initialValue;
        }

        /* data for lead surrogate code units */
        if(leadUnitValue!=initialValue) {
            limit=latin1Length+UTRIE_DATA_BLOCK_LENGTH;
            for(/* i=latin1Length */; i<limit; ++i) {
                p16[i]=(uint16_t)leadUnitValue;
            }
        }
    } else {
        uint32_t *p32;

        /* indexes to block 0 */
        uprv_memset(p16, 0, trie->indexLength*2);

        if(leadUnitValue!=initialValue) {
            /* indexes for lead surrogate code units to the block after Latin-1 */
            block=(uint16_t)(latin1Length>>UTRIE_INDEX_SHIFT);
            i=0xd800>>UTRIE_SHIFT;
            limit=0xdc00>>UTRIE_SHIFT;
            for(; i<limit; ++i) {
                p16[i]=block;
            }
        }

        trie->data32=p32=(uint32_t *)(p16+trie->indexLength);

        /* Latin-1 data */
        for(i=0; i<latin1Length; ++i) {
            p32[i]=initialValue;
        }

        /* data for lead surrogate code units */
        if(leadUnitValue!=initialValue) {
            limit=latin1Length+UTRIE_DATA_BLOCK_LENGTH;
            for(/* i=latin1Length */; i<limit; ++i) {
                p32[i]=leadUnitValue;
            }
        }
    }

    trie->getFoldingOffset=utrie_defaultGetFoldingOffset;

    return actualLength;
}